

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCryptionCommon.cpp
# Opt level: O2

ByteList * __thiscall
XCryptionCommon::OnObjectStart_abi_cxx11_
          (XCryptionCommon *this,longlong inObjectID,longlong inGenerationNumber)

{
  _List_base<unsigned_char,_std::allocator<unsigned_char>_> local_30;
  
  ComputeEncryptionKeyForObject_abi_cxx11_((ByteList *)&local_30,this,inObjectID,inGenerationNumber)
  ;
  std::__cxx11::
  list<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  ::push_back(&this->mEncryptionKeysStack,(value_type *)&local_30);
  std::__cxx11::_List_base<unsigned_char,_std::allocator<unsigned_char>_>::_M_clear(&local_30);
  return (ByteList *)
         ((this->mEncryptionKeysStack).
          super__List_base<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::__cxx11::list<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ._M_impl._M_node.super__List_node_base._M_prev + 1);
}

Assistant:

const ByteList& XCryptionCommon::OnObjectStart(long long inObjectID, long long inGenerationNumber) {
	mEncryptionKeysStack.push_back(ComputeEncryptionKeyForObject((ObjectIDType)inObjectID, (unsigned long)inGenerationNumber));

	return mEncryptionKeysStack.back();
}